

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

LogicalXorLayerParams * __thiscall
CoreML::Specification::LogicalXorLayerParams::New(LogicalXorLayerParams *this,Arena *arena)

{
  LogicalXorLayerParams *this_00;
  
  this_00 = (LogicalXorLayerParams *)operator_new(0x18);
  LogicalXorLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::LogicalXorLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

LogicalXorLayerParams* LogicalXorLayerParams::New(::google::protobuf::Arena* arena) const {
  LogicalXorLayerParams* n = new LogicalXorLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}